

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<unsigned_char,long_long,2>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *t,longlong *u,uchar *result)

{
  bool bVar1;
  undefined1 *in_RDX;
  long *in_RSI;
  byte *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<long_long,_true>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = (char)((long)(ulong)*in_RDI % *in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)((std::int64_t)t % (std::int64_t)u);
    }